

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,string *value,bool param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  string local_a0 [32];
  cmGeneratorExpression local_80;
  Property *property;
  cmListFileBacktrace local_60;
  undefined1 local_50 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  bool param_4_local;
  string *value_local;
  string *prop_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  this_00 = &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  cmMakefile::GetBacktrace((cmMakefile *)this_00);
  cmListFileBacktrace::cmListFileBacktrace(&local_60,(cmListFileBacktrace *)this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_50,&local_60);
  cmListFileBacktrace::~cmListFileBacktrace(&local_60);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
            ::operator[](&this->Properties,prop);
  local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this_01;
  std::__cxx11::string::string(local_a0,(string *)value);
  cmGeneratorExpression::Parse(&local_80,(string *)local_50);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::push_back((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               *)this_01,(value_type *)&local_80);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_80);
  std::__cxx11::string::~string(local_a0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const std::string& value,
                                     bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value));
}